

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::CreateObjectLists
          (cmMakefileTargetGenerator *this,bool useLinkScript,bool useArchiveRules,
          bool useResponseFile,string *buildObjs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,bool useWatcomQuote,string *linkLanguage,ResponseFlagFor responseMode)

{
  bool bVar1;
  cmMakefileTargetGenerator *this_00;
  char cVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  uint __val;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  string variableName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  object_strings;
  string variableNameExternal;
  char *__end;
  string responseFileName;
  string responseFlag;
  string local_1a0;
  cmMakefileTargetGenerator *local_180;
  string local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  string local_138;
  string local_118;
  char *local_f8;
  char *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  string local_e0;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_180 = this;
  local_e8 = makefile_depends;
  WriteObjectsVariable(this,&local_178,&local_138,useWatcomQuote);
  this_00 = local_180;
  if (useResponseFile) {
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    WriteObjectsStrings(local_180,&local_158,useWatcomQuote,0x1ffb8);
    GetResponseFlag_abi_cxx11_(&local_a8,this_00,responseMode);
    if (local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_158.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_f0 = "deviceObjects";
      if (responseMode == Link) {
        local_f0 = "objects";
      }
      local_f8 = local_f0 + 0xd;
      if (responseMode == Link) {
        local_f8 = local_f0 + 7;
      }
      uVar5 = 0;
      __val = 0;
      do {
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,local_f0,local_f8);
        __val = __val + 1;
        cVar3 = '\x01';
        if (9 < __val) {
          uVar4 = __val;
          cVar2 = '\x04';
          do {
            cVar3 = cVar2;
            if (uVar4 < 100) {
              cVar3 = cVar3 + -2;
              goto LAB_005ed5a5;
            }
            if (uVar4 < 1000) {
              cVar3 = cVar3 + -1;
              goto LAB_005ed5a5;
            }
            if (uVar4 < 10000) goto LAB_005ed5a5;
            bVar1 = 99999 < uVar4;
            uVar4 = uVar4 / 10000;
            cVar2 = cVar3 + '\x04';
          } while (bVar1);
          cVar3 = cVar3 + '\x01';
        }
LAB_005ed5a5:
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar3);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1a0._M_dataplus._M_p,(uint)local_1a0._M_string_length,__val);
        std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_e0);
        CreateResponseFile(&local_1a0,local_180,&local_e0,
                           local_158.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5,local_e8,linkLanguage);
        std::__cxx11::string::append((char *)buildObjs);
        std::__cxx11::string::_M_append((char *)buildObjs,(ulong)local_a8._M_dataplus._M_p);
        source._M_len._4_4_ = local_1a0._M_string_length._4_4_;
        source._M_len._0_4_ = (uint)local_1a0._M_string_length;
        source._M_str = local_1a0._M_dataplus._M_p;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_118,(cmOutputConverter *)local_180->LocalGenerator,source,SHELL,false);
        std::__cxx11::string::_M_append((char *)buildObjs,(ulong)local_118._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,
                          (ulong)(local_e0.field_2._M_allocated_capacity + 1));
        }
        uVar5 = (ulong)__val;
      } while (uVar5 < (ulong)((long)local_158.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_158);
  }
  else if (useLinkScript) {
    if (!useArchiveRules) {
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      WriteObjectsStrings(local_180,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_a8,useWatcomQuote,0xffffffffffffffff);
      std::__cxx11::string::_M_assign((string *)buildObjs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    }
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)0x2;
    local_a8._M_string_length = 0x8dbddf;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = local_178._M_string_length;
    local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_178._M_dataplus._M_p;
    local_80 = 0;
    local_78 = 4;
    local_70 = ") $(";
    local_68 = 0;
    local_60 = local_138._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_138._M_dataplus._M_p;
    local_50 = 0;
    local_e0.field_2._M_allocated_capacity = (long)&local_e0.field_2 + 8;
    local_e0._M_dataplus._M_p = (pointer)0x0;
    local_e0._M_string_length = 1;
    local_e0.field_2._M_local_buf[8] = ')';
    local_48 = 1;
    local_38 = 0;
    views._M_len = 5;
    views._M_array = (iterator)&local_a8;
    local_40 = (undefined1 *)local_e0.field_2._M_allocated_capacity;
    cmCatViews(&local_1a0,views);
    std::__cxx11::string::operator=((string *)buildObjs,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateObjectLists(
  bool useLinkScript, bool useArchiveRules, bool useResponseFile,
  std::string& buildObjs, std::vector<std::string>& makefile_depends,
  bool useWatcomQuote, std::string const& linkLanguage,
  ResponseFlagFor responseMode)
{
  std::string variableName;
  std::string variableNameExternal;
  this->WriteObjectsVariable(variableName, variableNameExternal,
                             useWatcomQuote);
  if (useResponseFile) {
    // MSVC response files cannot exceed 128K.
    std::string::size_type constexpr responseFileLimit = 131000;

    // Construct the individual object list strings.
    std::vector<std::string> object_strings;
    this->WriteObjectsStrings(object_strings, useWatcomQuote,
                              responseFileLimit);

    // Lookup the response file reference flag.
    std::string const responseFlag = this->GetResponseFlag(responseMode);

    // Write a response file for each string.
    const char* sep = "";
    for (unsigned int i = 0; i < object_strings.size(); ++i) {
      // Number the response files.
      std::string responseFileName =
        (responseMode == Link) ? "objects" : "deviceObjects";
      responseFileName += std::to_string(i + 1);
      responseFileName += ".rsp";

      // Create this response file.
      std::string objects_rsp = this->CreateResponseFile(
        responseFileName, object_strings[i], makefile_depends, linkLanguage);

      // Separate from previous response file references.
      buildObjs += sep;
      sep = " ";

      // Reference the response file.
      buildObjs += responseFlag;
      buildObjs += this->LocalGenerator->ConvertToOutputFormat(
        objects_rsp, cmOutputConverter::SHELL);
    }
  } else if (useLinkScript) {
    if (!useArchiveRules) {
      std::vector<std::string> objStrings;
      this->WriteObjectsStrings(objStrings, useWatcomQuote);
      buildObjs = objStrings[0];
    }
  } else {
    buildObjs =
      cmStrCat("$(", variableName, ") $(", variableNameExternal, ')');
  }
}